

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O3

Type __thiscall wasm::TypeMapper::getNewType(TypeMapper *this,Type type)

{
  const_iterator cVar1;
  Type type_00;
  key_type *pkVar2;
  key_type local_30;
  Type local_28;
  Type type_local;
  
  if ((type.id & 1) == 0 && 6 < type.id) {
    local_28.id = type.id;
    local_30.id = (uintptr_t)wasm::Type::getHeapType(&local_28);
    cVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->mapping->_M_h,&local_30);
    pkVar2 = (key_type *)
             ((long)cVar1.
                    super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                    ._M_cur + 0x10);
    if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
        _M_cur == (__node_type *)0x0) {
      pkVar2 = &local_30;
    }
    type_00 = wasm::Type::with(&local_28,pkVar2->id);
    type = GlobalTypeRewriter::getTempType(&this->super_GlobalTypeRewriter,type_00);
  }
  return (Type)type.id;
}

Assistant:

Type getNewType(Type type) {
    if (!type.isRef()) {
      return type;
    }
    return getTempType(type.with(getNewHeapType(type.getHeapType())));
  }